

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial-3.cpp
# Opt level: O2

void requestPage(string *url)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string hostname;
  string service;
  string local_128 [32];
  string path;
  undefined1 local_e8 [40];
  resolver resolver;
  query query;
  
  service._M_dataplus._M_p = (pointer)&service.field_2;
  service._M_string_length = 0;
  hostname._M_dataplus._M_p = (pointer)&hostname.field_2;
  hostname._M_string_length = 0;
  service.field_2._M_local_buf[0] = '\0';
  hostname.field_2._M_local_buf[0] = '\0';
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  parseURL(url,&service,&hostname,&path);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(&resolver.impl_,&io_service,(type *)0x0);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
            (&query,&hostname,&service,address_configured);
  std::__cxx11::string::string(local_128,(string *)url);
  boost::
  bind<void,boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::__cxx11::string,boost::arg<1>(*)(),boost::arg<2>(*)(),std::__cxx11::string>
            ((bind_t<void,_void_(*)(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::_bi::list3<boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_e8,(boost *)resolveHandler,boost::asio::placeholders::error,
             boost::asio::placeholders::iterator,(_func_arg<2> *)local_128,in_R9);
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_resolve<boost::_bi::bind_t<void,void(*)(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::__cxx11::string),boost::_bi::list3<boost::arg<1>(*)(),boost::arg<2>(*)(),boost::_bi::value<std::__cxx11::string>>>>
            ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&resolver,&query,
             (bind_t<void,_void_(*)(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::_bi::list3<boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_e8);
  std::__cxx11::string::~string((string *)(local_e8 + 8));
  std::__cxx11::string::~string(local_128);
  boost::asio::io_context::run(&io_service);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::~basic_resolver_query(&query);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&resolver.impl_);
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::~string((string *)&hostname);
  std::__cxx11::string::~string((string *)&service);
  return;
}

Assistant:

void readHandler(
    const boost::system::error_code&    error,
    size_t                              bytes_transferred,
    socket_ptr                          socket,
    array_ptr                           readBuffer
){
    if( error && error != boost::asio::error::eof ){
        cerr << "Read error: " << error << endl;
        exit( READ_FAILURE );
    }

    // We have received some data, so now we'll write it out.
    cout.write( readBuffer->data(), bytes_transferred );

    // If we haven't reached the end of file yet, trigger another asynchronous read just like the
    // one in the `writeHandler`.
    if( error != boost::asio::error::eof ){
        boost::asio::async_read(
            *socket,
            boost::asio::buffer( *readBuffer ),
            boost::bind(
                &readHandler,
                boost::asio::placeholders::error,
                boost::asio::placeholders::bytes_transferred,
                socket,
                readBuffer
            )
        );
    }
}